

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Literals * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getGlobal
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Name name)

{
  Module *pMVar1;
  bool bVar2;
  __shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2> *this_00;
  Export *this_01;
  Name *pNVar3;
  mapped_type *pmVar4;
  Name NVar5;
  Name NVar6;
  Name NVar7;
  Export *globalExport;
  Importable *local_30;
  Global *global;
  ModuleRunner *inst;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Name name_local;
  
  NVar5.super_IString.str._M_str = name.super_IString.str._M_len;
  global = (Global *)self(this);
  NVar5.super_IString.str._M_len =
       (size_t)((ModuleRunnerBase<wasm::ModuleRunner> *)&global->super_Importable)->wasm;
  local_30 = (Importable *)::wasm::Module::getGlobal(NVar5);
  while( true ) {
    bVar2 = Importable::imported(local_30);
    if (!bVar2) break;
    this_00 = &std::
               map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
               ::at((map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
                     *)&global[6].super_Importable.base,&local_30->module)->
               super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>;
    global = (Global *)
             std::__shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    NVar6.super_IString.str._M_str = (char *)(local_30->base).super_IString.str._M_len;
    NVar6.super_IString.str._M_len =
         (size_t)((ModuleRunnerBase<wasm::ModuleRunner> *)&global->super_Importable)->wasm;
    this_01 = (Export *)::wasm::Module::getExport(NVar6);
    pMVar1 = ((ModuleRunnerBase<wasm::ModuleRunner> *)&global->super_Importable)->wasm;
    pNVar3 = Export::getInternalName(this_01);
    NVar7.super_IString.str._M_str = (char *)(pNVar3->super_IString).str._M_len;
    NVar7.super_IString.str._M_len = (size_t)pMVar1;
    local_30 = (Importable *)::wasm::Module::getGlobal(NVar7);
  }
  pmVar4 = std::
           map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
           ::operator[]((map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                         *)&(global->super_Importable).base,(key_type *)local_30);
  return pmVar4;
}

Assistant:

Literals& getGlobal(Name name) {
    auto* inst = self();
    auto* global = inst->wasm.getGlobal(name);
    while (global->imported()) {
      inst = inst->linkedInstances.at(global->module).get();
      Export* globalExport = inst->wasm.getExport(global->base);
      global = inst->wasm.getGlobal(*globalExport->getInternalName());
    }

    return inst->globals[global->name];
  }